

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImGuiWindow *window;
  ImGuiViewportP *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 *pIVar3;
  ImVec2 mx;
  ImVec2 IVar4;
  ImVec2 IVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect IVar18;
  ImVec2 local_18;
  
  pIVar2 = GImGui;
  if ((GImGui->NavDisableHighlight == false) &&
     (window = GImGui->NavWindow, (GImGui->NavDisableMouseHover & window != (ImGuiWindow *)0x0) != 0
     )) {
    IVar18 = WindowRectRelToAbs(window,window->NavRectRel + GImGui->NavLayer);
    fVar8 = IVar18.Max.x;
    fVar9 = IVar18.Max.y;
    fVar14 = IVar18.Min.x;
    fVar15 = IVar18.Min.y;
    fVar16 = (float)extraout_XMM0_Qb;
    fVar17 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
    if ((window->LastFrameActive != pIVar2->FrameCount) &&
       ((((fVar10 = (window->ScrollTarget).x, fVar10 != 3.4028235e+38 || (NAN(fVar10))) ||
         (fVar10 = (window->ScrollTarget).y, fVar10 != 3.4028235e+38)) || (NAN(fVar10))))) {
      IVar4 = CalcNextScrollFromScrollTargetAndClamp(window);
      fVar10 = (window->Scroll).x - IVar4.x;
      fVar11 = (window->Scroll).y - IVar4.y;
      fVar12 = 0.0 - (float)extraout_XMM0_Qb_00;
      fVar13 = 0.0 - (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      fVar14 = fVar14 + fVar10;
      fVar15 = fVar15 + fVar11;
      fVar16 = fVar16 + fVar12;
      fVar17 = fVar17 + fVar13;
      fVar8 = fVar8 + fVar10;
      fVar9 = fVar9 + fVar11;
      in_XMM1_Dc = in_XMM1_Dc + fVar12;
      in_XMM1_Dd = in_XMM1_Dd + fVar13;
    }
    auVar6._0_4_ = (pIVar2->Style).FramePadding.x * 4.0;
    auVar6._4_4_ = (pIVar2->Style).FramePadding.y;
    auVar6._8_8_ = 0;
    auVar7._4_4_ = fVar9 - fVar15;
    auVar7._0_4_ = fVar8 - fVar14;
    auVar7._8_4_ = in_XMM1_Dc - fVar16;
    auVar7._12_4_ = in_XMM1_Dd - fVar17;
    auVar7 = minps(auVar6,auVar7);
    local_18.y = fVar9 - auVar7._4_4_;
    local_18.x = fVar14 + auVar7._0_4_;
    pIVar1 = *(GImGui->Viewports).Data;
    IVar4 = (pIVar1->super_ImGuiViewport).Pos;
    IVar5 = (pIVar1->super_ImGuiViewport).Size;
    mx.x = IVar5.x + IVar4.x;
    mx.y = IVar5.y + IVar4.y;
    IVar5 = ImClamp(&local_18,&(pIVar1->super_ImGuiViewport).Pos,mx);
    IVar4.x = (float)(int)IVar5.x;
    IVar4.y = (float)(int)IVar5.y;
  }
  else {
    pIVar3 = &GImGui->MouseLastValidPos;
    if (-256000.0 <= (GImGui->IO).MousePos.y && -256000.0 <= (GImGui->IO).MousePos.x) {
      pIVar3 = &(GImGui->IO).MousePos;
    }
    IVar4.x = pIVar3->x + 1.0;
    IVar4.y = pIVar3->y;
  }
  return IVar4;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}